

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O0

uint32 BailOutRecord::BailOutFromLoopBodyHelper
                 (JavascriptCallStackLayout *layout,BailOutRecord *bailOutRecord,
                 uint32 bailOutOffset,BailOutKind bailOutKind,Var branchValue,Var *registerSaves,
                 BailOutReturnValue *bailOutReturnValue)

{
  JavascriptFunction *this;
  code *pcVar1;
  InterpreterStackFrame *newInstance;
  bool bVar2;
  uint uVar3;
  LocalFunctionId LVar4;
  int iVar5;
  undefined4 *puVar6;
  FunctionBody *this_00;
  ScriptContext *this_01;
  ThreadContext *pTVar7;
  undefined4 extraout_var;
  char16 *pcVar8;
  undefined4 extraout_var_00;
  char16 *pcVar9;
  char *pcVar10;
  Var *pArgumentsObject;
  wchar local_b8 [4];
  char16 debugStringBuffer [42];
  InterpreterStackFrame *interpreterFrame;
  ScriptContext *functionScriptContext;
  FunctionBody *executeFunction;
  JavascriptFunction *function;
  Var *registerSaves_local;
  Var branchValue_local;
  BailOutKind bailOutKind_local;
  uint32 bailOutOffset_local;
  BailOutRecord *bailOutRecord_local;
  JavascriptCallStackLayout *layout_local;
  
  if (bailOutRecord->parent != (BailOutRecord *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x547,"(bailOutRecord->parent == nullptr)",
                       "bailOutRecord->parent == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  this = *(JavascriptFunction **)layout;
  this_00 = Js::JavascriptFunction::GetFunctionBody(this);
  Js::FunctionBody::SetRecentlyBailedOutOfJittedLoopBody(this_00,true);
  this_01 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)this_00);
  pTVar7 = Js::ScriptContext::GetThreadContext(this_01);
  ThreadContext::ClearDisableImplicitFlags(pTVar7);
  pTVar7 = Js::ScriptContext::GetThreadContext(this_01);
  register0x00000000 = ThreadContext::GetLeafInterpreterFrame(pTVar7);
  uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this_00);
  LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this_00);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,uVar3,LVar4);
  if (((bVar2) && ((bailOutKind != BailOnSimpleJitToFullJitLoopBody || ((DAT_01ec73ca & 1) != 0))))
     && ((bVar2 = Js::NumberSet::Empty((NumberSet *)&DAT_01eca2c8), bVar2 ||
         (bVar2 = Js::NumberSet::Contains((NumberSet *)&DAT_01eca2c8,bailOutKind), bVar2)))) {
    iVar5 = (*(this_00->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
    pcVar9 = Js::FunctionProxy::GetDebugNumberSet((FunctionProxy *)this_00,(wchar (*) [42])local_b8)
    ;
    uVar3 = Js::InterpreterStackFrame::GetCurrentLoopNum(stack0xffffffffffffffa0);
    pcVar8 = Js::OpCodeUtil::GetOpCodeName(bailOutRecord->bailOutOpcode);
    Output::Print(L"BailOut: function: %s (%s) Loop: %d offset: #%04x Opcode: %s",
                  CONCAT44(extraout_var,iVar5),pcVar9,(ulong)uVar3,(ulong)bailOutOffset,pcVar8);
    if (bailOutKind != BailOutInvalid) {
      pcVar10 = GetBailOutKindName(bailOutKind);
      Output::Print(L" Kind: %S",pcVar10);
    }
    Output::Print(L"\n");
  }
  uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this_00);
  LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this_00);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,BailOutPhase,uVar3,LVar4);
  if (((bVar2) && ((bailOutKind != BailOnSimpleJitToFullJitLoopBody || ((DAT_01ec73ca & 1) != 0))))
     && ((bVar2 = Js::NumberSet::Empty((NumberSet *)&DAT_01eca2c8), bVar2 ||
         (bVar2 = Js::NumberSet::Contains((NumberSet *)&DAT_01eca2c8,bailOutKind), bVar2)))) {
    iVar5 = (*(this_00->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
    uVar3 = Js::InterpreterStackFrame::GetCurrentLoopNum(stack0xffffffffffffffa0);
    pcVar9 = Js::OpCodeUtil::GetOpCodeName(bailOutRecord->bailOutOpcode);
    Output::Print(L"BailOut: function %s, Loop: %d Opcode: %s",CONCAT44(extraout_var_00,iVar5),
                  (ulong)uVar3,pcVar9);
    if (bailOutKind != BailOutInvalid) {
      pcVar10 = GetBailOutKindName(bailOutKind);
      Output::Print(L" Kind: %S",pcVar10);
    }
    Output::Print(L"\n");
  }
  newInstance = stack0xffffffffffffffa0;
  pArgumentsObject = Js::JavascriptCallStackLayout::GetArgumentsObjectLocation(layout);
  RestoreValues(bailOutRecord,bailOutKind,layout,newInstance,this_01,true,registerSaves,
                bailOutReturnValue,pArgumentsObject,branchValue,(void *)0x0,true,(void *)0x0);
  uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this_00);
  LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this_00);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,BailOutPhase,uVar3,LVar4);
  if (!bVar2) {
    uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this_00);
    LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this_00);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,uVar3,LVar4);
    if (!bVar2) goto LAB_00508a41;
  }
  Output::Flush();
LAB_00508a41:
  UpdatePolymorphicFieldAccess(this,bailOutRecord);
  return bailOutOffset;
}

Assistant:

uint32
BailOutRecord::BailOutFromLoopBodyHelper(Js::JavascriptCallStackLayout * layout, BailOutRecord const * bailOutRecord,
    uint32 bailOutOffset, IR::BailOutKind bailOutKind, Js::Var branchValue, Js::Var *registerSaves, BailOutReturnValue * bailOutReturnValue)
{
    Assert(bailOutRecord->parent == nullptr);

    Js::JavascriptFunction * function = layout->functionObject;

    Js::FunctionBody * executeFunction = function->GetFunctionBody();
    executeFunction->SetRecentlyBailedOutOfJittedLoopBody(true);

    Js::ScriptContext * functionScriptContext = executeFunction->GetScriptContext();

    // Clear the disable implicit call bit in case we bail from that region
    functionScriptContext->GetThreadContext()->ClearDisableImplicitFlags();

    // The current interpreter frame for the loop body
    Js::InterpreterStackFrame * interpreterFrame = functionScriptContext->GetThreadContext()->GetLeafInterpreterFrame();
#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
    BAILOUT_KIND_TRACE(executeFunction, bailOutKind, _u("BailOut: function: %s (%s) Loop: %d offset: #%04x Opcode: %s"),
        executeFunction->GetDisplayName(), executeFunction->GetDebugNumberSet(debugStringBuffer), interpreterFrame->GetCurrentLoopNum(),
        bailOutOffset, Js::OpCodeUtil::GetOpCodeName(bailOutRecord->bailOutOpcode));

    BAILOUT_TESTTRACE(executeFunction, bailOutKind, _u("BailOut: function %s, Loop: %d Opcode: %s"), executeFunction->GetDisplayName(),
        interpreterFrame->GetCurrentLoopNum(), Js::OpCodeUtil::GetOpCodeName(bailOutRecord->bailOutOpcode));

    // Restore bailout values
    bailOutRecord->RestoreValues(bailOutKind, layout, interpreterFrame, functionScriptContext, true, registerSaves, bailOutReturnValue, layout->GetArgumentsObjectLocation(), branchValue);

    BAILOUT_FLUSH(executeFunction);

    UpdatePolymorphicFieldAccess(function, bailOutRecord);

    // Return the resume byte code offset from the loop body to restart interpreter execution.
    return bailOutOffset;
}